

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_unicode.c
# Opt level: O0

void utf8fromcodepoint(PHYSFS_uint32 cp,char **_dst,PHYSFS_uint64 *_len)

{
  ulong uVar1;
  byte bVar2;
  byte *pbVar3;
  PHYSFS_uint64 local_30;
  PHYSFS_uint64 len;
  char *dst;
  PHYSFS_uint64 *_len_local;
  char **_dst_local;
  PHYSFS_uint32 cp_local;
  
  len = (PHYSFS_uint64)*_dst;
  uVar1 = *_len;
  if (uVar1 != 0) {
    if (cp < 0x110000) {
      if ((cp == 0xfffe) || (cp == 0xffff)) {
        _dst_local._4_4_ = 0x3f;
      }
      else if ((((cp == 0xd800) || (cp - 0xdb7f < 2)) || (cp - 0xdbff < 2)) ||
              ((cp == 0xdf80 || (_dst_local._4_4_ = cp, cp == 0xdfff)))) {
        _dst_local._4_4_ = 0x3f;
      }
    }
    else {
      _dst_local._4_4_ = 0x3f;
    }
    bVar2 = (byte)_dst_local._4_4_;
    if (_dst_local._4_4_ < 0x80) {
      *(byte *)len = bVar2;
      local_30 = uVar1 - 1;
      len = (PHYSFS_uint64)(len + 1);
    }
    else if (_dst_local._4_4_ < 0x800) {
      if (uVar1 < 2) {
        local_30 = 0;
      }
      else {
        pbVar3 = (byte *)(len + 1);
        *(byte *)len = (byte)(_dst_local._4_4_ >> 6) | 0xc0;
        len = len + 2;
        *pbVar3 = bVar2 & 0x3f | 0x80;
        local_30 = uVar1 - 2;
      }
    }
    else if (_dst_local._4_4_ < 0x10000) {
      if (uVar1 < 3) {
        local_30 = 0;
      }
      else {
        *(byte *)len = (byte)(_dst_local._4_4_ >> 0xc) | 0xe0;
        pbVar3 = (byte *)(len + 2);
        *(byte *)(len + 1) = (byte)(_dst_local._4_4_ >> 6) & 0x3f | 0x80;
        len = len + 3;
        *pbVar3 = bVar2 & 0x3f | 0x80;
        local_30 = uVar1 - 3;
      }
    }
    else if (uVar1 < 4) {
      local_30 = 0;
    }
    else {
      *(byte *)len = (byte)(_dst_local._4_4_ >> 0x12) | 0xf0;
      *(byte *)(len + 1) = (byte)(_dst_local._4_4_ >> 0xc) & 0x3f | 0x80;
      pbVar3 = (byte *)(len + 3);
      *(byte *)(len + 2) = (byte)(_dst_local._4_4_ >> 6) & 0x3f | 0x80;
      len = len + 4;
      *pbVar3 = bVar2 & 0x3f | 0x80;
      local_30 = uVar1 - 4;
    }
    *_dst = (char *)len;
    *_len = local_30;
  }
  return;
}

Assistant:

static void utf8fromcodepoint(PHYSFS_uint32 cp, char **_dst, PHYSFS_uint64 *_len)
{
    char *dst = *_dst;
    PHYSFS_uint64 len = *_len;

    if (len == 0)
        return;

    if (cp > 0x10FFFF)
        cp = UNICODE_BOGUS_CHAR_CODEPOINT;
    else if ((cp == 0xFFFE) || (cp == 0xFFFF))  /* illegal values. */
        cp = UNICODE_BOGUS_CHAR_CODEPOINT;
    else
    {
        /* There are seven "UTF-16 surrogates" that are illegal in UTF-8. */
        switch (cp)
        {
            case 0xD800:
            case 0xDB7F:
            case 0xDB80:
            case 0xDBFF:
            case 0xDC00:
            case 0xDF80:
            case 0xDFFF:
                cp = UNICODE_BOGUS_CHAR_CODEPOINT;
        } /* switch */
    } /* else */

    /* Do the encoding... */
    if (cp < 0x80)
    {
        *(dst++) = (char) cp;
        len--;
    } /* if */

    else if (cp < 0x800)
    {
        if (len < 2)
            len = 0;
        else
        {
            *(dst++) = (char) ((cp >> 6) | 128 | 64);
            *(dst++) = (char) (cp & 0x3F) | 128;
            len -= 2;
        } /* else */
    } /* else if */

    else if (cp < 0x10000)
    {
        if (len < 3)
            len = 0;
        else
        {
            *(dst++) = (char) ((cp >> 12) | 128 | 64 | 32);
            *(dst++) = (char) ((cp >> 6) & 0x3F) | 128;
            *(dst++) = (char) (cp & 0x3F) | 128;
            len -= 3;
        } /* else */
    } /* else if */

    else
    {
        if (len < 4)
            len = 0;
        else
        {
            *(dst++) = (char) ((cp >> 18) | 128 | 64 | 32 | 16);
            *(dst++) = (char) ((cp >> 12) & 0x3F) | 128;
            *(dst++) = (char) ((cp >> 6) & 0x3F) | 128;
            *(dst++) = (char) (cp & 0x3F) | 128;
            len -= 4;
        } /* else if */
    } /* else */

    *_dst = dst;
    *_len = len;
}